

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAddressCode.cpp
# Opt level: O2

string * MyCompiler::visitTerm
                   (string *__return_storage_ptr__,Term *ast,
                   vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
                   *result,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *usedIdents,int *tempIdentCounter)

{
  bool bVar1;
  pointer ppVar2;
  string *psVar3;
  string aFactor;
  string aSecondFactor;
  string local_f8;
  pointer local_d8;
  string local_d0;
  string local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  visitFactor(&local_f8,
              (ast->pFactor).super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr,result,usedIdents,tempIdentCounter);
  ppVar2 = (ast->vMulDivOpFactor).
           super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8 = (ast->vMulDivOpFactor).
             super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (ppVar2 == local_d8) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,local_f8.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f8.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_f8._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,local_f8.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_f8._M_string_length;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    bVar1 = false;
    for (; ppVar2 != local_d8; ppVar2 = ppVar2 + 1) {
      visitFactor(&local_d0,&ppVar2->second,result,usedIdents,tempIdentCounter);
      if (!bVar1) {
        nextTempIdent(&local_b0,usedIdents,tempIdentCounter);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::string
                ((string *)&local_b0,(string *)&(ppVar2->first).super_AbstractAstNode.value);
      psVar3 = &local_f8;
      if (bVar1) {
        psVar3 = __return_storage_ptr__;
      }
      std::__cxx11::string::string(local_90,(string *)psVar3);
      std::__cxx11::string::string(local_70,(string *)&local_d0);
      std::__cxx11::string::string(local_50,(string *)__return_storage_ptr__);
      std::
      vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
      ::emplace_back<std::array<std::__cxx11::string,4ul>>
                ((vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
                  *)result,
                 (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                  *)&local_b0);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
              *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      bVar1 = true;
    }
  }
  std::__cxx11::string::~string((string *)&local_f8);
  return __return_storage_ptr__;
}

Assistant:

std::string MyCompiler::visitTerm(MyCompiler::Term &ast,
                                  std::vector<std::array<std::string, 4>> &result,
                                  std::unordered_set<std::string> &usedIdents,
                                  int &tempIdentCounter)
{
    std::string aFactor = visitFactor(*ast.pFactor, result, usedIdents, tempIdentCounter);

    if (ast.vMulDivOpFactor.empty())
        return aFactor;

    bool moreFactor = false;
    std::string temp;

    for (auto &item : ast.vMulDivOpFactor)
    {

        std::string aSecondFactor = visitFactor(item.second, result, usedIdents, tempIdentCounter);
        if (!moreFactor)
            temp = nextTempIdent(usedIdents, tempIdentCounter);
        result.push_back({item.first.value,
                          moreFactor ? temp : aFactor,
                          aSecondFactor,
                          temp});
        moreFactor = true;
    }

    return temp;
}